

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ADIOS.cpp
# Opt level: O0

void __thiscall adios2::core::ADIOS::ADIOS(ADIOS *this,string *configFile,string *hostLanguage)

{
  string *in_RDX;
  string *in_RSI;
  string *in_stack_00000268;
  Comm *in_stack_00000270;
  string *in_stack_00000278;
  ADIOS *in_stack_00000280;
  string local_70 [56];
  string local_38 [56];
  
  std::__cxx11::string::string(local_38,in_RSI);
  helper::CommDummy();
  std::__cxx11::string::string(local_70,in_RDX);
  ADIOS(in_stack_00000280,in_stack_00000278,in_stack_00000270,in_stack_00000268);
  std::__cxx11::string::~string(local_70);
  helper::Comm::~Comm((Comm *)0x8445a1);
  std::__cxx11::string::~string(local_38);
  return;
}

Assistant:

ADIOS::ADIOS(const std::string configFile, const std::string hostLanguage)
: ADIOS(configFile, helper::CommDummy(), hostLanguage)
{
}